

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O1

void tchecker::from_string(clock_constraint_container_t *c,clock_variables_t *clocks,string *str)

{
  int iVar1;
  invalid_argument *piVar2;
  clock_constraints_visitor_t v;
  shared_ptr<tchecker::typed_expression_t> typed_expr;
  shared_ptr<tchecker::expression_t> expr;
  integer_variables_t no_integer_variables;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  long *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  expression_t *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  undefined1 local_d0 [80];
  variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  
  iVar1 = std::__cxx11::string::compare((char *)str);
  if (iVar1 != 0) {
    local_d0._0_8_ = local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
    parsing::parse_expression((parsing *)&local_108,(string *)local_d0,str);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if (local_108 == (expression_t *)0x0) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "syntax error in ",str);
      std::invalid_argument::invalid_argument(piVar2,(string *)local_d0);
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    memset((integer_variables_t *)local_d0,0,0xa0);
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    local_e0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc:292:27)>
               ::_M_invoke;
    local_e8 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc:292:27)>
               ::_M_manager;
    typecheck((tchecker *)&local_118,local_108,(integer_variables_t *)local_d0,
              (integer_variables_t *)local_d0,clocks,
              (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)&local_f8);
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    }
    if (local_118 == (long *)0x0) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_138,"type error in expression ",str);
      std::invalid_argument::invalid_argument(piVar2,(string *)&local_138);
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_138._M_dataplus._M_p = (pointer)&PTR__typed_expression_visitor_t_001e1608;
    local_138._M_string_length = (size_type)c;
    (**(code **)(*local_118 + 0x30))();
    if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
    }
    variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~variables_t(&local_80);
    variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~variables_t((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d0);
    if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
    }
  }
  return;
}

Assistant:

void from_string(tchecker::clock_constraint_container_t & c, tchecker::clock_variables_t const & clocks,
                 std::string const & str)
{
  if (str == "")
    return;

  // parse str as a typed expression
  std::shared_ptr<tchecker::expression_t> expr{tchecker::parsing::parse_expression("", str)};
  if (expr.get() == nullptr)
    throw std::invalid_argument("syntax error in " + str);

  tchecker::integer_variables_t no_integer_variables;
  std::shared_ptr<tchecker::typed_expression_t> typed_expr{
      tchecker::typecheck(*expr, no_integer_variables, no_integer_variables, clocks,
                          [](std::string const & err) { std::cerr << tchecker::log_error << err << std::endl; })};
  if (typed_expr.get() == nullptr)
    throw std::invalid_argument("type error in expression " + str);

  // instantiate a typed expression visitor, add each clock constraint from expression to c
  try {
    tchecker::clock_constraints_visitor_t v(c);
    typed_expr->visit(v);
  }
  catch (...) {
    throw std::invalid_argument("error in " + str);
  }
}